

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_bool(void)

{
  _Bool _Var1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bool *p_Var5;
  bson_t *bcon;
  _Bool b;
  
  uVar3 = bson_bcon_magic();
  _Var1 = bcon_ensure_bool(true);
  uVar3 = bcon_new(0,"foo",uVar3,7,_Var1);
  uVar4 = bson_bcone_magic();
  p_Var5 = bcon_ensure_bool_ptr((_Bool *)((long)&bcon + 7));
  bVar2 = bcon_extract(uVar3,"foo",uVar4,7,p_Var5,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x6c,"test_bool","BCON_EXTRACT (bcon, \"foo\", BCONE_BOOL (b))");
    abort();
  }
  if ((bcon._7_1_ & 1) != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x6e,"test_bool","b == true");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bool (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_bool (&expected, "foo", -1, 1);

   BCON_APPEND (&bcon, "foo", BCON_BOOL (1));

   bson_eq_bson (&bcon, &expected);

   bson_reinit (&bcon);
   bson_reinit (&expected);

   bson_append_bool (&expected, "foo", -1, 0);

   BCON_APPEND (&bcon, "foo", BCON_BOOL (0));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}